

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_make_vector_op(sexp ctx,sexp self,sexp_sint_t n,sexp len,sexp dflt)

{
  undefined1 auVar1 [16];
  sexp psVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  if ((sexp)&DAT_00000001 < len) {
    uVar6 = (long)len >> 1;
    if (uVar6 >> 0x3d != 0) {
      psVar2 = sexp_xtype_exception(ctx,self,"vector length out of range",len);
      return psVar2;
    }
    psVar2 = (sexp)sexp_alloc(ctx,uVar6 * 8 + 0x10);
    if (psVar2 == (sexp)0x0) {
      if (iRam0000000000000000 == 0x13) {
        return (sexp)0x0;
      }
    }
    else {
      if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 0x13)) {
        return psVar2;
      }
      psVar2->tag = 10;
    }
    auVar1 = _DAT_0012e010;
    lVar3 = uVar6 + (uVar6 == 0);
    lVar4 = lVar3 + -1;
    auVar7._8_4_ = (int)lVar4;
    auVar7._0_8_ = lVar4;
    auVar7._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar5 = 0;
    auVar7 = auVar7 ^ _DAT_0012e010;
    auVar8 = _DAT_0012e000;
    do {
      auVar9 = auVar8 ^ auVar1;
      if ((bool)(~(auVar9._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar9._0_4_ ||
                  auVar7._4_4_ < auVar9._4_4_) & 1)) {
        *(sexp *)((long)&psVar2->value + uVar5 * 8 + 8) = dflt;
      }
      if ((auVar9._12_4_ != auVar7._12_4_ || auVar9._8_4_ <= auVar7._8_4_) &&
          auVar9._12_4_ <= auVar7._12_4_) {
        *(sexp *)((long)&psVar2->value + uVar5 * 8 + 0x10) = dflt;
      }
      uVar5 = uVar5 + 2;
      lVar4 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar4 + 2;
    } while ((lVar3 + 1U & 0x3ffffffffffffffe) != uVar5);
    (psVar2->value).stack.length = uVar6;
  }
  else {
    psVar2 = (sexp)(((ctx->value).type.setters)->value).context.mark_stack[2].prev;
  }
  return psVar2;
}

Assistant:

sexp sexp_make_vector_op (sexp ctx, sexp self, sexp_sint_t n, sexp len, sexp dflt) {
  sexp vec, *x;
  sexp_sint_t i, clen = sexp_unbox_fixnum(len);
  if (! clen) return sexp_global(ctx, SEXP_G_EMPTY_VECTOR);
  if (clen < 0 || clen > SEXP_MAX_VECTOR_LENGTH)
    return sexp_xtype_exception(ctx, self, "vector length out of range", len);
  vec = sexp_alloc_tagged(ctx, sexp_sizeof(vector) + clen*sizeof(sexp),
                          SEXP_VECTOR);
  if (sexp_exceptionp(vec)) return vec;
  x = sexp_vector_data(vec);
  for (i=0; i<clen; i++)
    x[i] = dflt;
  sexp_vector_length(vec) = clen;
  return vec;
}